

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmMakefile *this_00;
  cmTarget *pcVar1;
  iterator iVar2;
  string *this_01;
  cmTarget *tgt;
  string namespacedTarget;
  cmTarget *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = target->Makefile;
  pcVar1 = cmMakefile::FindTargetToUse(this_00,input,false);
  if ((pcVar1 != (cmTarget *)0x0) && (pcVar1->IsImportedTarget == false)) {
    local_78 = pcVar1;
    iVar2 = std::
            _Rb_tree<cmTarget_*,_cmTarget_*,_std::_Identity<cmTarget_*>,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>
            ::find(&(this->ExportedTargets)._M_t,&local_78);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      (*this->_vptr_cmExportFileGenerator[4])(this,&local_70,missingTargets,this_00,target,local_78)
      ;
      if (local_70._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)input);
      }
      this_01 = &local_70;
    }
    else {
      cmTarget::GetExportName_abi_cxx11_(&local_50,local_78);
      std::operator+(&local_70,&this->Namespace,&local_50);
      std::__cxx11::string::operator=((string *)input,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      this_01 = &local_50;
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  return pcVar1 != (cmTarget *)0x0;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmMakefile *mf = target->GetMakefile();

  cmTarget *tgt = mf->FindTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              mf, target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}